

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::emit_load(CompilerHLSL *this,Instruction *instruction)

{
  uint type;
  uint32_t id_00;
  ID id_01;
  Variant *pVVar1;
  bool bVar2;
  byte bVar3;
  uint32_t *puVar4;
  ulong uVar5;
  SPIRAccessChain *chain;
  SPIRType *pSVar6;
  iterator iVar7;
  SPIRExpression *e;
  uint32_t id;
  string load_expr;
  uint32_t local_74;
  string local_70;
  string local_50;
  
  puVar4 = Compiler::stream((Compiler *)this,instruction);
  uVar5 = (ulong)puVar4[2];
  if (((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
       buffer_size <= uVar5) ||
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar5].type != TypeAccessChain)) {
    CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
    return;
  }
  chain = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar5);
  type = *puVar4;
  id_00 = puVar4[1];
  id_01.id = puVar4[2];
  local_74 = id_00;
  bVar2 = Compiler::has_decoration((Compiler *)this,id_01,DecorationNonUniform);
  if (bVar2) {
    CompilerGLSL::propagate_nonuniform_qualifier(&this->super_CompilerGLSL,id_01.id);
  }
  pSVar6 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr + type);
  if (((pSVar6->array).super_VectorView<unsigned_int>.buffer_size == 0) &&
     (*(int *)&(pSVar6->super_IVariant).field_0xc != 0xf)) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    read_access_chain(this,&local_70,&local_50,chain);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bVar2 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,id_01.id);
    if ((bVar2) &&
       (iVar7 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&(this->super_CompilerGLSL).super_Compiler.forced_temporaries._M_h,&local_74)
       , iVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) {
      bVar3 = 1;
    }
    else {
      CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id)
      ;
      bVar3 = 0;
    }
    bVar2 = (bool)(pSVar6->columns < 2 & bVar3);
    e = CompilerGLSL::emit_op(&this->super_CompilerGLSL,type,local_74,&local_70,bVar2,true);
    e->need_transpose = false;
    Compiler::register_read((Compiler *)this,local_74,id_01.id,bVar2);
    Compiler::inherit_expression_dependencies((Compiler *)this,local_74,id_01.id);
    if (bVar2 != false) {
      Compiler::add_implied_read_expression((Compiler *)this,e,(chain->super_IVariant).self.id);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return;
  }
  CompilerGLSL::emit_uninitialized_temporary_expression(&this->super_CompilerGLSL,type,id_00);
  CompilerGLSL::to_expression_abi_cxx11_(&local_70,&this->super_CompilerGLSL,id_00,true);
  read_access_chain(this,(string *)0x0,&local_70,chain);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  CompilerGLSL::track_expression_read(&this->super_CompilerGLSL,(chain->super_IVariant).self.id);
  return;
}

Assistant:

void CompilerHLSL::emit_load(const Instruction &instruction)
{
	auto ops = stream(instruction);

	auto *chain = maybe_get<SPIRAccessChain>(ops[2]);
	if (chain)
	{
		uint32_t result_type = ops[0];
		uint32_t id = ops[1];
		uint32_t ptr = ops[2];

		if (has_decoration(ptr, DecorationNonUniformEXT))
			propagate_nonuniform_qualifier(ptr);

		auto &type = get<SPIRType>(result_type);
		bool composite_load = !type.array.empty() || type.basetype == SPIRType::Struct;

		if (composite_load)
		{
			// We cannot make this work in one single expression as we might have nested structures and arrays,
			// so unroll the load to an uninitialized temporary.
			emit_uninitialized_temporary_expression(result_type, id);
			read_access_chain(nullptr, to_expression(id), *chain);
			track_expression_read(chain->self);
		}
		else
		{
			string load_expr;
			read_access_chain(&load_expr, "", *chain);

			bool forward = should_forward(ptr) && forced_temporaries.find(id) == end(forced_temporaries);

			// If we are forwarding this load,
			// don't register the read to access chain here, defer that to when we actually use the expression,
			// using the add_implied_read_expression mechanism.
			if (!forward)
				track_expression_read(chain->self);

			// Do not forward complex load sequences like matrices, structs and arrays.
			if (type.columns > 1)
				forward = false;

			auto &e = emit_op(result_type, id, load_expr, forward, true);
			e.need_transpose = false;
			register_read(id, ptr, forward);
			inherit_expression_dependencies(id, ptr);
			if (forward)
				add_implied_read_expression(e, chain->self);
		}
	}
	else
		CompilerGLSL::emit_instruction(instruction);
}